

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void nlohmann::detail::int_to_string<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target,
               size_t value)

{
  string local_38;
  size_t local_18;
  size_t value_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target_local;
  
  local_18 = value;
  value_local = (size_t)target;
  std::__cxx11::to_string(&local_38,value);
  std::__cxx11::string::operator=((string *)value_local,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void int_to_string( string_type& target, std::size_t value )
{
    target = std::to_string(value);
}